

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_memory_object.h
# Opt level: O3

void __thiscall
SharedMemoryObject<pthread_barrier_t>::SharedMemoryObject<>
          (SharedMemoryObject<pthread_barrier_t> *this)

{
  pthread_barrier_t *ppVar1;
  ContextManager *pCVar2;
  string local_30;
  
  ppVar1 = (pthread_barrier_t *)allocate_shared_memory(0x20);
  ppVar1->__align = 0;
  *(char *)((long)ppVar1 + 8) = '\0';
  *(char *)((long)ppVar1 + 9) = '\0';
  *(char *)((long)ppVar1 + 10) = '\0';
  *(char *)((long)ppVar1 + 0xb) = '\0';
  *(char *)((long)ppVar1 + 0xc) = '\0';
  *(char *)((long)ppVar1 + 0xd) = '\0';
  *(char *)((long)ppVar1 + 0xe) = '\0';
  *(char *)((long)ppVar1 + 0xf) = '\0';
  *(char *)((long)ppVar1 + 0x10) = '\0';
  *(char *)((long)ppVar1 + 0x11) = '\0';
  *(char *)((long)ppVar1 + 0x12) = '\0';
  *(char *)((long)ppVar1 + 0x13) = '\0';
  *(char *)((long)ppVar1 + 0x14) = '\0';
  *(char *)((long)ppVar1 + 0x15) = '\0';
  *(char *)((long)ppVar1 + 0x16) = '\0';
  *(char *)((long)ppVar1 + 0x17) = '\0';
  *(char *)((long)ppVar1 + 0x18) = '\0';
  *(char *)((long)ppVar1 + 0x19) = '\0';
  *(char *)((long)ppVar1 + 0x1a) = '\0';
  *(char *)((long)ppVar1 + 0x1b) = '\0';
  *(char *)((long)ppVar1 + 0x1c) = '\0';
  *(char *)((long)ppVar1 + 0x1d) = '\0';
  *(char *)((long)ppVar1 + 0x1e) = '\0';
  *(char *)((long)ppVar1 + 0x1f) = '\0';
  this->ptr_ = ppVar1;
  if (ppVar1 == (pthread_barrier_t *)0xffffffffffffffff) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Cannot allocate %zu bytes of shared memory: %m",0x20);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

explicit SharedMemoryObject(Args &&... args) {
        ptr_ = static_cast<T *>(allocate_shared_memory(sizeof(T)));
        ptr_ = new(ptr_) T(args...);
        if (ptr_ == MAP_FAILED) {
            die(format("Cannot allocate %zu bytes of shared memory: %m", sizeof(T)));
        }
    }